

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_compute_table_impl.h
# Opt level: O1

void secp256k1_ecmult_compute_table(secp256k1_ge_storage *table,int window_g,secp256k1_gej *gen)

{
  undefined4 in_register_00000034;
  long lVar1;
  secp256k1_ge dgen;
  secp256k1_ge ge;
  secp256k1_gej gj;
  secp256k1_ge local_190;
  secp256k1_ge local_128;
  secp256k1_gej local_c0;
  
  memcpy(&local_c0,(secp256k1_gej *)CONCAT44(in_register_00000034,window_g),0x98);
  secp256k1_ge_set_gej_var(&local_128,&local_c0);
  secp256k1_ge_to_storage(table,&local_128);
  secp256k1_gej_double_var
            (&local_c0,(secp256k1_gej *)CONCAT44(in_register_00000034,window_g),(secp256k1_fe *)0x0)
  ;
  secp256k1_ge_set_gej_var(&local_190,&local_c0);
  lVar1 = 0x40;
  do {
    secp256k1_gej_set_ge(&local_c0,&local_128);
    secp256k1_gej_add_ge_var(&local_c0,&local_c0,&local_190,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var(&local_128,&local_c0);
    secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(table->x).n + lVar1),&local_128);
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

static void secp256k1_ecmult_compute_table(secp256k1_ge_storage* table, int window_g, const secp256k1_gej* gen) {
    secp256k1_gej gj;
    secp256k1_ge ge, dgen;
    int j;

    gj = *gen;
    secp256k1_ge_set_gej_var(&ge, &gj);
    secp256k1_ge_to_storage(&table[0], &ge);

    secp256k1_gej_double_var(&gj, gen, NULL);
    secp256k1_ge_set_gej_var(&dgen, &gj);

    for (j = 1; j < ECMULT_TABLE_SIZE(window_g); ++j) {
        secp256k1_gej_set_ge(&gj, &ge);
        secp256k1_gej_add_ge_var(&gj, &gj, &dgen, NULL);
        secp256k1_ge_set_gej_var(&ge, &gj);
        secp256k1_ge_to_storage(&table[j], &ge);
    }
}